

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_textedit_move_to_word_next(nk_text_edit *state)

{
  int iVar1;
  nk_text_edit *in_RDI;
  bool bVar2;
  int c;
  int len;
  int local_10;
  int idx;
  
  idx = (in_RDI->string).len;
  local_10 = in_RDI->cursor;
  do {
    local_10 = local_10 + 1;
    bVar2 = false;
    if (local_10 < idx) {
      iVar1 = nk_is_word_boundary(in_RDI,idx);
      bVar2 = iVar1 == 0;
    }
  } while (bVar2);
  if (idx < local_10) {
    local_10 = idx;
  }
  return local_10;
}

Assistant:

NK_INTERN int
nk_textedit_move_to_word_next(struct nk_text_edit *state)
{
const int len = state->string.len;
int c = state->cursor+1;
while( c < len && !nk_is_word_boundary(state, c))
++c;

if( c > len )
c = len;

return c;
}